

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::ReleasePages(PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
               *this,void *address,uint pageCount,void *segmentParam)

{
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *this_00;
  HANDLE pVVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  HANDLE pVVar6;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
  *fromSegmentList;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *pPVar7;
  ulong uVar8;
  ulong pageCount_00;
  
  if (this->maxAllocPageCount < pageCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x635,"(pageCount <= this->maxAllocPageCount)",
                       "pageCount <= this->maxAllocPageCount");
    if (!bVar3) goto LAB_00670c14;
    *puVar5 = 0;
  }
  bVar3 = ValidThreadAccess(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x637,"(this->ValidThreadAccess())",
                       "Page allocation should only be used by a single thread");
    if (!bVar3) goto LAB_00670c14;
    *puVar5 = 0;
  }
  iVar4 = (*this->_vptr_PageAllocatorBase[3])(this);
  if ((char)iVar4 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x638,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar3) goto LAB_00670c14;
    *puVar5 = 0;
  }
  if (this->disablePageReuse == true) {
    pVVar1 = this->processHandle;
    pVVar6 = GetCurrentProcess();
    if (pVVar1 != pVVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x63d,"(this->processHandle == GetCurrentProcess())",
                         "this->processHandle == GetCurrentProcess()");
      if (!bVar3) {
LAB_00670c14:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    VirtualFree(address,(ulong)(pageCount << 0xc),0x4000);
    return;
  }
  PageTracking::ReportFree((PageAllocator *)this,address,(ulong)(pageCount << 0xc));
  fromSegmentList =
       GetSegmentList(this,(PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam);
  if (fromSegmentList ==
      (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)0x0)
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x647,"(fromSegmentList != nullptr)","fromSegmentList != nullptr");
    if (!bVar3) goto LAB_00670c14;
    *puVar5 = 0;
  }
  pageCount_00 = (ulong)pageCount;
  if ((ulong)this->maxFreePageCount < this->freePageCount + pageCount_00) {
    if ((this->zeroPages != false) ||
       (this_00 = &this->emptySegments,
       (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
       (this->emptySegments).
       super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>.next.
       base == this_00)) {
      PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DecommitPages<false>
                ((PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam,address,
                 pageCount);
      LogFreePages(this,pageCount_00);
      LogDecommitPages(this,pageCount_00);
      this->decommitPageCount = this->decommitPageCount + pageCount_00;
      goto LAB_00670bf7;
    }
    pPVar7 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
             Head(this_00);
    if (pPVar7->decommitPageCount != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x65f,"(emptySegments.Head().GetDecommitPageCount() == 0)",
                         "emptySegments.Head().GetDecommitPageCount() == 0");
      if (!bVar3) goto LAB_00670c14;
      *puVar5 = 0;
    }
    pPVar7 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
             Head(this_00);
    LogFreeSegment(this,&pPVar7->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>);
    DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
    RemoveHead<Memory::NoThrowHeapAllocator>
              (this_00,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance);
    uVar8 = this->freePageCount - (ulong)this->maxAllocPageCount;
    this->freePageCount = uVar8;
    if (uVar8 < this->debugMinFreePageCount) {
      this->debugMinFreePageCount = uVar8;
    }
  }
  else if ((DAT_0145c440 == '\x01') && (this->queueZeroPages == true)) {
    bVar3 = HasZeroPageQueue(this);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x67e,"(HasZeroPageQueue())","HasZeroPageQueue()");
      if (!bVar3) goto LAB_00670c14;
      *puVar5 = 0;
    }
    AddPageToZeroQueue(this,address,pageCount,
                       (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam);
    return;
  }
  memset(address,0xfe,(ulong)(pageCount << 0xc));
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::ReleasePages
            ((PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam,address,
             pageCount);
  LogFreePages(this,pageCount_00);
  AddFreePageCount(this,pageCount);
LAB_00670bf7:
  TransferSegment(this,(PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam,
                  fromSegmentList);
  return;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::ReleasePages(__in void * address, uint pageCount, __in void * segmentParam)
{
    Assert(pageCount <= this->maxAllocPageCount);
    TPageSegment * segment = (TPageSegment*) segmentParam;
    ASSERT_THREAD();
    Assert(!this->HasMultiThreadAccess());

#ifdef RECYCLER_NO_PAGE_REUSE
    if (disablePageReuse)
    {
        Assert(this->processHandle == GetCurrentProcess());
#pragma prefast(suppress:6250, "Calling 'VirtualFree' without the MEM_RELEASE flag might free memory but not address descriptors (VADs).")
        VirtualFree(address, pageCount * AutoSystemInfo::PageSize, MEM_DECOMMIT);
        return;
    }
#endif

    PageTracking::ReportFree((PageAllocator*)this, address, AutoSystemInfo::PageSize * pageCount);

    DListBase<TPageSegment> * fromSegmentList = GetSegmentList(segment);
    Assert(fromSegmentList != nullptr);

    /**
     * The logic here is as follows:
     * - If we have sufficient pages already, such that the newly free pages are going
     *   to cause us to exceed the threshold of free pages we want:
     *     - First check and see if we have empty segments. If we do, just release that
     *       entire segment back to the operating system, and add the current segments
     *       free pages to our free page pool
     *     - Otherwise, if there are no empty segments (i.e our memory is fragmented),
     *       decommit the pages that are being released so that they don't count towards
     *       our working set
     * - If we don't have enough pages:
     *    - If we're in the free page queuing mode where we have a "pages to zero out" queue
     *      put it in that queue and we're done
     *    - Otherwise, zero it out, and add it to the free page pool
     *  Now that we've either decommitted or freed the pages in the segment,
     *  move the segment to the right segment list
     */
    if (this->freePageCount + pageCount > maxFreePageCount)
    {
        // Release a whole segment if possible to reduce the number of VirtualFree and fragmentation
        if (!ZeroPages() && !emptySegments.Empty())
        {
            Assert(emptySegments.Head().GetDecommitPageCount() == 0);
            LogFreeSegment(&emptySegments.Head());
            emptySegments.RemoveHead(&NoThrowNoMemProtectHeapAllocator::Instance);
            this->freePageCount -= maxAllocPageCount;

#if DBG
            UpdateMinimum(this->debugMinFreePageCount, this->freePageCount);
            MemSetLocal(address, DbgMemFill, AutoSystemInfo::PageSize * pageCount);
#endif
            segment->ReleasePages(address, pageCount);
            LogFreePages(pageCount);
            this->AddFreePageCount(pageCount);

        }
        else
        {
            segment->template DecommitPages<false>(address, pageCount);
            LogFreePages(pageCount);
            LogDecommitPages(pageCount);
#if DBG_DUMP
            this->decommitPageCount += pageCount;
#endif
        }
    }
    else
    {
#if ENABLE_BACKGROUND_PAGE_ZEROING
        if (CONFIG_FLAG(EnableBGFreeZero))
        {
            if (QueueZeroPages())
            {
                Assert(HasZeroPageQueue());
                AddPageToZeroQueue(address, pageCount, segment);
                return;
            }
        }
#endif

        this->FillFreePages((char *)address, pageCount);
        segment->ReleasePages(address, pageCount);
        LogFreePages(pageCount);
        this->AddFreePageCount(pageCount);
    }

    TransferSegment(segment, fromSegmentList);
}